

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O0

Var Js::JavascriptString::TrimLeftRightHelper<false,true>
              (JavascriptString *arg,ScriptContext *scriptContext)

{
  code *pcVar1;
  charcount_t span;
  bool bVar2;
  charcount_t cVar3;
  char16 *pcVar4;
  undefined4 *puVar5;
  JavascriptLibrary *this;
  ScriptContext *pSVar6;
  charcount_t local_38;
  char16 ch;
  int idxEnd;
  int idxStart;
  char16 *string;
  int len;
  ScriptContext *scriptContext_local;
  JavascriptString *arg_local;
  
  cVar3 = GetLength(arg);
  pcVar4 = GetString(arg);
  local_38 = cVar3;
  do {
    span = local_38;
    local_38 = span - 1;
    if ((int)local_38 < 0) break;
    bVar2 = IsWhiteSpaceCharacter(pcVar4[(int)local_38]);
  } while (bVar2);
  if ((int)local_38 < 0) {
    if (local_38 != 0xffffffff) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                  ,0x9e8,"(idxEnd == -1)","idxEnd == -1");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    this = ScriptContext::GetLibrary(scriptContext);
    arg_local = JavascriptLibrary::GetEmptyString(this);
  }
  else if (local_38 == cVar3 - 1) {
    pSVar6 = RecyclableObject::GetScriptContext(&arg->super_RecyclableObject);
    arg_local = arg;
    if (scriptContext != pSVar6) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                  ,0x9f4,"(scriptContext == arg->GetScriptContext())",
                                  "Should have already marshaled the string in cross site thunk");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  else {
    arg_local = (JavascriptString *)SubstringCore(arg,0,span,scriptContext);
  }
  return arg_local;
}

Assistant:

Var JavascriptString::TrimLeftRightHelper(JavascriptString* arg, ScriptContext* scriptContext)
    {
        static_assert(trimLeft || trimRight, "bad template instance of TrimLeftRightHelper()");

        int len = arg->GetLength();
        const char16 *string = arg->GetString();

        int idxStart = 0;
        if (trimLeft)
        {
            for (; idxStart < len; idxStart++)
            {
                char16 ch = string[idxStart];
                if (IsWhiteSpaceCharacter(ch))
                {
                    continue;
                }
                break;
            }

            if (len == idxStart)
            {
                return (scriptContext->GetLibrary()->GetEmptyString());
            }
        }

        int idxEnd = len - 1;
        if (trimRight)
        {
            for (; idxEnd >= 0; idxEnd--)
            {
                char16 ch = string[idxEnd];
                if (IsWhiteSpaceCharacter(ch))
                {
                    continue;
                }
                break;
            }

            if (!trimLeft)
            {
                if (idxEnd < 0)
                {
                    Assert(idxEnd == -1);
                    return (scriptContext->GetLibrary()->GetEmptyString());
                }
            }
            else
            {
                Assert(idxEnd >= 0);
            }
        }

        if (idxStart == 0 && idxEnd == len - 1)
        {
            AssertMsg(scriptContext == arg->GetScriptContext(), "Should have already marshaled the string in cross site thunk");
            return arg;
        }

        return SubstringCore(arg, idxStart, idxEnd - idxStart + 1, scriptContext);
    }